

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_ConstructorTest_Test::~ConfidentialTransaction_ConstructorTest_Test
          (ConfidentialTransaction_ConstructorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, ConstructorTest) {
  uint32_t lock_time = 0;
  ConfidentialTransaction tx_null;
  EXPECT_STREQ(tx_null.GetHex().c_str(), "0200000000000000000000");

  const ConfidentialTransaction tx_empty(2, lock_time);
  EXPECT_STREQ(tx_empty.GetHex().c_str(), "0200000000000000000000");

  ConfidentialTransaction tx(exp_tx_hex);
  EXPECT_STREQ(tx.GetHex().c_str(), exp_tx_hex.c_str());

  ByteData exp_data = ByteData(exp_tx_hex);
  ConfidentialTransaction tx_b(exp_data);
  ByteData data = tx_b.GetData();
  EXPECT_STREQ(data.GetHex().c_str(), exp_tx_hex.c_str());

  EXPECT_NO_THROW((tx_null = tx));
  EXPECT_STREQ(
      tx_null.GetHex().c_str(),
      "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000bd2cc1584c002deb65cc52301e1622f482a2f588b9800d2b8386ffabf74d6b2d73d17503a2f921976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000004c4b40000000000000");
  EXPECT_NO_THROW((tx = ConfidentialTransaction(tx_empty)));
  EXPECT_STREQ(tx.GetHex().c_str(), "0200000000000000000000");

  // illegal transaction
  //const std::string txout_empty = "";
  //EXPECT_NO_THROW((tx = ConfidentialTransaction(txout_empty)));
  //EXPECT_STREQ(tx.GetHex().c_str(), txout_empty.c_str());

  const std::string txin_empty =
      "020000000100020b6c4dbd4a5ede07d381fc4f0f69c4166d59da5557c627d8361c13dc28103bbeeb084922fb4232da7c9d12c88dcbf329175771bf4333bbbea23343e86023490253b4025cf9778d533b213387a1e8b68d2acea450ac5ce68c9a550ffefb448a98cec1511976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000004c4b4000000000000043010001df8972dc12c7f680d8e1b95222c6e59a0e888d7b3eeea43f7ea41da798443f4034bd02edf6cc9d62cb17d119455f8448cc1e69b6000a6e981380311629ec2475fdcd0d602b000000000000000132af0c6c272999d7ea18001bcfd47a844970bd56b678f59302420fb180ccf25296953926cae9fd36f8ce6e169ab2e18e06175df111db4b55d6954cb8478dce9d847d6f1a57f8dd1c48194caab6d939a76843d154f7021b5b86230edf86366043c5d131a3a845c7470dfde074d7c453100975c0962af42d88da3d6364a7cf4a6123cb4f0e9f0d3d9a7eb96896e52d53bda4cabdd5225056855afcaa2464afc8c8d582d77dc1764b1b238b38e0550400282b33b3e3fbc15473a700aa7955f7f2f0a65ee384783dd173423c6637588a351df2ae60a7ed15e7740f4c77496f04a831e7b66755a354605c0c2eb1d5646483116e5155c384febacc2849b74c1c8d7163da96e5d510ff044ede7ec3a85f2dc32fd5991993ace8a0266726e6c2acca04667acd2b9cd8bf83e87927e06d608f6b22a90806d98e49fff37dfc018123b7b81a85dbfdc8cfb5ccbfa4cc987bf15bd1c927a0665d83cfd2ab9840066c638ace43a6818f7977d896e3612d491bad635c724bf453d5c397dc2b1dc3ed5d64fd9845f45f7af923cabdb32dc946f7c73f927644a141799838a759c918eccd7561144d825246fb84d4355a955c641fd339c0f79d3eb0a4754cff203897b124d1f27b3590acb97b934cfce48e9ce84d9d4078df9f1bd85ac138bc232026ec901e1e8873466d0cea38e1b4ea2c8e923bd301f59769cdc5c61a4b831bea0fb84ff9454a7e4f8f71d699d6927937c257a3c0ea29f9edf1e1fc2a1f22e6adacd711571fc55d548169a6440d83070c9c57b4954666d17fd1d914915e25fada803efb59f38748c77422fc979279f79d5d76a80421e7330989e873d1e5226273f0a4428595fd10f7e2449a216a32903e542fdf7313cc002c74caa676db4b4137d26b1e1a2789e45922556d0ddf0adc0ff15875900f7708a526ee7c4b226b1643d61f3d62de8a6921d4e4000a4c1f65e2507f97300bf18fbb4cef8ecb6add5b01b0c47fd52fd5f4811f1a04b5fcd2a0165cd4d9d9fafdfefca998f796f207d521ed338d2a0aae0c8c41eb51f385071ba2f8eced53f91673e7d756cee0cb9a4ac6335c389c2e138d696508fb9eaf90bbc4f50e9b091e87b1192b64ed0d61cdeaef8b7084c912388aa9c19f514a27597d88f966944298fc9006ae4236cb7d9f3eea7f48fa7b51826b74eaf67bd790a8c8cc3bf9a74db88341f634522b0ac035e016ba9a9e94d262a9899c41f20998f3523f8714e4ccf6b032122bfff0b0bd0a0829888a3d600ec6ba9b20d66ea0ed650e346bd74f590bc83ffc1c02f2091433cdb531c0ba9ac2f91dc0bd30988b11068dd976702544d6fa48235f974aca9b54b38cc8fd789d0f47b48bc9acae3ef585576c58eb846140aa4d703cd380b33ff06b34710871115634ff50c58807d2ed5461e7574775cd51667cd729d4d72f557db3e98d2816b02efb74ca52fb3cd9b15e792f8b33b14370723bbc454eeb70aa66b6d2f104d8519002eb335c9416bad7641dafffe4debec24ad435b9746d63dd2d76bbcaf415e90cfb51f3eddba9a649fb8462bd3627d261625fc95f83cb765f31ae8520129ca2c470b06ac7e5b41f023ad06f25ff0f7cbf9dad137010eb376e0cc3f99cbc716953e863364cd80d97b25988a9510dc617666d7a13da224364ebea7ca5ac03975752a979a21c73861b483165bd5bf4d2d3b402e43da34d58d9131e2207a8454666ac9d55eba79a2267ab5e731c1ce73f59782f5187a5e2f198598f0d86f18303177789830bc74d59167804f030a772753cf134932c880b7074ca7fa001a94f3c540e37e0e72d025106116b6df49fc24fe47200676025e0b45d594ac45c99ac3d481091ec7c4c218d1ad19e00a300be998f870f6252132d62820f0664afa88726b6f327da0c017bf6a9b34f152107524cee9140280acd704a0066cb5faa4e31ebbed5cea9497c573ac49ce32d99347b61f171d8bb431c7f25358e4da4213ea08886bf4691b060b2d2738ecabc2dc8459ebf64bc12d42105335d5e8bfe2bf7fd91db941c0921cd4bee04a3942b2dad6609a9c762e8ea9e28aeaa85758d0c8336da4c0f988e630e30522793e51a773bf509c761b347e98faf822e40aa62156364fb31153eb17d0a1b04792a9535169871378d301a525c8726d984c18bc9a83edf8a24997c20e1613d4144f07506e0f7fd97cee78b469eacfd0a6dcf5157b070a2d9ade2c3e3fd88413adc5e408bcdc75d8093a7aa12a08ea15dd57535073717ed3a1c2073703febca53c3fd048c992dfdeae58d7a91bd86cb30b4de40e4fccaca42db652d979225de33b17be881c95d65883a818f71118c4ae0f1d9d5044f729a2d71aacba8352b4b4ce4ec1b32f84b6eb899591ca0e15d8f6ba328fa0fb54a59445ddf934b55747d71795cc5f8ef9f2f020c9dbc5d3d668b0adb252d5dda38d93750a2d010fea412e32a8854ff464e945bc29ea8ec47f424928cebb920f7c159a5347fce9e034f4d50d680308f9ff6f93b88638f533a3728ddb715829e228c5269c8df3a381e1dc6605ed5a922d48532b6537fcfda1962a1eb4097321266826f10256178b98de34fda9327b379b38519d08a6a5dada265fa038772b706a0f65faf257c7d0d28fb7c2cc98203ad16b833a5dfb37601304c7752d959e2894584528860542b197d75ed7e7e2f412db8a3308f99e34a873e6f4ce21473ecd77d936faf07d1bd5e7c61c6bdc448ab7cb5a2811908ddfd39f9026dbaf67ad4ad12c59377fc0aedec2d6f21e2b3097753fec81ab749444b14c1e22b72fe89d92347e8be6ad9d966cacadff45f6ff517ea8c8be6df77acb4561ba87ee0eddd61f230ef177b84bc702fd0f882b19d5662517ce6f75432464eb9801f14b28a195ab1367282ed807665e8fa866751d32313e89bc30bb7bbeaba6edf78434b42eed146507bb594f2fac22bdfddb1b2dee48e4de07f56701f2f2821075b91ea3dfd5ac2a8e62db57d77d77afd1b55815f3d6978157f307e823f12991a222764997fd0e52f4788994b2649f9de558131d9145fcde4461f4a1d545cd8b385feebec31b43aebcaf40280b2de6101c350da43a97d72e9821e38e648a89363fe8ce4a7a5de1c226390943926e812d204ee22758bed6712d0a47f24ddbd1ee7080ea0e362252506852e3793ad00ec4dad89e210b240cff3132eb1e3834e1dadd56cef093786858c2ac8b55e2871e76e37c07ed23bbd3933c515a7a5b68a9c15e7acdf9deddeeadc98a0f5960e6ba76ccbf391884ceee470b3bbedc9e3fed2f277d9123bdd5435a5ba2522b984ea81eba2deb390d6e00f7acd7512d53c29014482976124593ecb13fd0630b08ae0005bb71eb56649ec8403f67942c17a024764f0dbb8dd4d463ce8ee6bb203fd8335f4940d0d46cd33e82ae87cc46921075a21ee17ad07e2e03c8fbd13b47e3b0018aa2bb77dacfee2ee66a807d10f1923ab673bcc92ecdf453910acecaaa471188d69ada006ae7de5cee5e48e1f64beb4763a945bd95aabeb3057b0a41ad544417d40fe8c915ac6f057fa5df28d056a1f4ca18a62c6d35eafbd766f0ad1d72c86b2305d6e3de0cffb40878a0cc1a1e4bf27d14197ff77516b56b657be3264559bca3654c95bfe7673a3c6dd831d088f0e758470ee69ca6f526938675fce01309f6377121c34429ca496bb89e4d091249dc7a2f5da35207ad7385c8f9d3a644ada38c3faabc0fbbc6a01021f612ef76f2e53ded390c36affa56d1365aeaaeb85469ce4d3619037196818e87e867532b1c417f19afe4795c5389803c30a064f42cfe68fbfb518f13bf84fc4f77c9d32df00818bcb831684a6149963c4851a3c7675a67f0111634abb3ed5d2995f4ff1cce9388e72e2be2e36efa28f29037a181ba09c2d30970024e9ca817d5c230a381d0402db6adaeb03375367eaad425b147b86211807b7ed68245ddc44bdbc32c818fad968e036fad46ca3d8c2a5b956c0228b61e1f66c0fbfd232e29fefbb51f2c68a7db0c3dd429db1a94277607c8323c288e596d53aec34c78c6db00370342c43354313ec4b012d3797d5ee23f38f91f2ac8c1e8043e4b84503e0c9e3fd0aa1c61d3f2c6e2202efd1f9a147ceaa456fffe841294e6ab1f055e5981217d8595bdf2254085656bf8686bf6972f3269de24e2afd82c159e38b97745c0cb6d5b584135c75ae86feff435d4d2071c5fb9b68e8a7ea4e2b987abe20811e1a99656ce5ff93260b6896812f6359ab5fa7fd6fb4066a158ac63abf39a8e1fa1d47e011ba33806c339078c6212e2c6fe794580bb27069fe70ff48c42e3bb2587bfa49650173d1991920ef8c3cd216f389ff2fb53fccaf88f9a8f1688aa4e2d577dc79ba41603721bdfe86073472d275d28896296c0e30842a85c06a6018b0a8d94bb72eeaba5fe09b0000ff7b29748e52ceb9088ab3224a2e6036932f484348cdf77dd326de421c0066d4b68102db6739347a19736cfe2dfaa90e488d4dc885d969f000f2e17bf9e52f7e870eb054d51ca9c435ed1378ecf8dd2541fc32ac662b588460b553e1820c6b1ca6d067442943a56806a6ea57c95bb013db6c474f049df048d322eaadb6a9fbfdd9f2c25511227787fe63fe4d0a80b1785d5d85c10398550cc2385e9bab225d58babe8268d3659fda6ccfdc23556ec27a924b9dee51b09ba03d1366704d63129f701c7e51cc80278faf69cdd7200f29f53f36094142677ce517e734b3b1bbf831548d2224b4dd0bd32370092f771e730f86dcc27fe80b663e95b51e33c0a303ca456e2ab688e84015ac29d8b782b3d79bdd69ce843af5e547616c4beba83c3b49e7041cbbda0545885864410353e581c657dd629646f43d4485d712cfaaf29ab15a023e6082e9b6ab21429fed74425d44eb7b00a0c9a5c6211a7041a31130ed92d1a2d385a540d827fe75cab210d8d508d55246a9143bcf24e8cddea3a5881d3814ada09e7685c9aee3caf7ea5855a79b0000";
  EXPECT_NO_THROW((tx = ConfidentialTransaction(txin_empty)));
  EXPECT_STREQ(tx.GetHex().c_str(), txin_empty.c_str());
}